

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NewFrame(void)

{
  ImVector<ImGuiContextHook> *this;
  ImVector<ImGuiViewportP_*> *pIVar1;
  ImGuiNavItemData *pIVar2;
  ImVec2 *pIVar3;
  ImGuiNextWindowData *pIVar4;
  int *piVar5;
  ImVector<float> *this_00;
  ImVector<ImGuiTableTempData> *this_01;
  ImVec2 *pIVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImFontAtlas *pIVar10;
  char *pcVar11;
  ImGuiViewportP *pIVar12;
  ImVec2 IVar13;
  byte bVar14;
  ImGuiContext *pIVar15;
  ImGuiContext *pIVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  int n;
  ImGuiID IVar21;
  ImGuiKeyModFlags IVar22;
  ImGuiContextHook *pIVar23;
  ImFont **ppIVar24;
  long lVar25;
  ImGuiViewportP **ppIVar26;
  ImFont *font;
  ImGuiWindow *pIVar27;
  ImGuiPopupData *pIVar28;
  ImGuiWindow **ppIVar29;
  float *pfVar30;
  ImGuiTable *table;
  ImGuiTableTempData *pIVar31;
  ImRect *pIVar32;
  int i;
  ImGuiID IVar33;
  ImGuiWindow *window;
  long lVar34;
  ImGuiWindow *parent;
  ImGuiWindow *pIVar35;
  ImGuiInputSource IVar36;
  ImGuiWindow *old_nav_window;
  bool *pbVar37;
  ImGuiContext *pIVar38;
  int n_1;
  int iVar39;
  int iVar40;
  ImGuiNavDirSourceFlags dir_sources;
  float *pfVar41;
  long lVar42;
  ImGuiNavLayer IVar43;
  float *pfVar44;
  ImGuiNavItemData *pIVar45;
  byte bVar46;
  uint uVar47;
  uint uVar48;
  float fVar49;
  float fVar50;
  ImVec2 IVar51;
  ImVec2 IVar52;
  ImVec2 IVar53;
  ImVec2 IVar55;
  double dVar54;
  undefined1 auVar56 [16];
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  ImRect IVar66;
  long lStack_80;
  float local_78;
  float local_68;
  float fStack_64;
  ImRect local_58;
  ImVec2 local_48;
  ImGuiContext *local_38;
  
  pIVar15 = GImGui;
  bVar46 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0xf44,"void ImGui::NewFrame()");
  }
  this = &GImGui->Hooks;
  iVar39 = (GImGui->Hooks).Size;
  while (0 < iVar39) {
    iVar39 = iVar39 + -1;
    pIVar23 = ImVector<ImGuiContextHook>::operator[](this,iVar39);
    if (*(int *)(pIVar23 + 4) == 7) {
      pIVar23 = ImVector<ImGuiContextHook>::operator[](this,iVar39);
      ImVector<ImGuiContextHook>::erase(this,pIVar23);
    }
  }
  CallContextHooks(pIVar15,ImGuiContextHookType_NewFramePre);
  pIVar38 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bf1,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  iVar39 = GImGui->FrameCount;
  if ((GImGui->IO).DeltaTime <= 0.0) {
    if (iVar39 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x1bf2,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  else if ((iVar39 != 0) && (GImGui->FrameCountEnded != iVar39)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bf3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bf4,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar10 = (GImGui->IO).Fonts;
  if ((pIVar10->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bf5,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  ppIVar24 = ImVector<ImFont_*>::operator[](&pIVar10->Fonts,0);
  if ((*ppIVar24)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bf6,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((pIVar38->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bf7,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((pIVar38->Style).CircleTessellationMaxError <= 0.0) {
    __assert_fail("g.Style.CircleTessellationMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bf8,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar49 = (pIVar38->Style).Alpha;
  if ((fVar49 < 0.0) || (1.0 < fVar49)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bf9,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((pIVar38->Style).WindowMinSize.x < 1.0) || ((pIVar38->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bfa,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (pIVar38->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bfb,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar25 = 0;
  while (lVar25 != 0x16) {
    piVar5 = (pIVar38->IO).KeyMap + lVar25;
    lVar25 = lVar25 + 1;
    if (0x200 < *piVar5 + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown)))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x1bfd,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  if ((((pIVar38->IO).ConfigFlags & 1) != 0) && ((pIVar38->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1c01,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((pIVar38->IO).ConfigWindowsResizeFromEdges == true) &&
     (((pIVar38->IO).BackendFlags & 2) == 0)) {
    (pIVar38->IO).ConfigWindowsResizeFromEdges = false;
  }
  pIVar38 = GImGui;
  if (GImGui->SettingsLoaded == false) {
    if ((GImGui->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x2868,"void ImGui::UpdateSettings()");
    }
    pcVar11 = (GImGui->IO).IniFilename;
    if (pcVar11 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar11);
    }
    pIVar38->SettingsLoaded = true;
  }
  if ((0.0 < pIVar38->SettingsDirtyTimer) &&
     (fVar49 = pIVar38->SettingsDirtyTimer - (pIVar38->IO).DeltaTime,
     pIVar38->SettingsDirtyTimer = fVar49, fVar49 <= 0.0)) {
    pcVar11 = (pIVar38->IO).IniFilename;
    if (pcVar11 == (char *)0x0) {
      (pIVar38->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar11);
    }
    pIVar38->SettingsDirtyTimer = 0.0;
  }
  pIVar15->Time = (double)(pIVar15->IO).DeltaTime + pIVar15->Time;
  pIVar15->WithinFrameScope = true;
  pIVar15->FrameCount = pIVar15->FrameCount + 1;
  pIVar15->TooltipOverrideCount = 0;
  pIVar15->WindowsActiveCount = 0;
  iVar40 = 0;
  ImVector<unsigned_int>::resize(&pIVar15->MenusIdSubmittedThisFrame,0);
  fVar49 = (pIVar15->IO).DeltaTime;
  iVar39 = pIVar15->FramerateSecPerFrameIdx;
  pIVar15->FramerateSecPerFrameAccum =
       (fVar49 - pIVar15->FramerateSecPerFrame[iVar39]) + pIVar15->FramerateSecPerFrameAccum;
  pIVar15->FramerateSecPerFrame[iVar39] = fVar49;
  pIVar15->FramerateSecPerFrameIdx = (iVar39 + 1) % 0x78;
  iVar39 = 0x77;
  if (pIVar15->FramerateSecPerFrameCount < 0x77) {
    iVar39 = pIVar15->FramerateSecPerFrameCount;
  }
  pIVar15->FramerateSecPerFrameCount = iVar39 + 1;
  uVar47 = -(uint)(0.0 < pIVar15->FramerateSecPerFrameAccum);
  (pIVar15->IO).Framerate =
       (float)(~uVar47 & 0x7f7fffff |
              (uint)(1.0 / (pIVar15->FramerateSecPerFrameAccum / (float)(iVar39 + 1))) & uVar47);
  pIVar38 = GImGui;
  if ((GImGui->Viewports).Size != 1) {
    __assert_fail("g.Viewports.Size == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x2997,"void ImGui::UpdateViewportsNewFrame()");
  }
  pIVar1 = &GImGui->Viewports;
  ppIVar26 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,0);
  pIVar12 = *ppIVar26;
  (pIVar12->super_ImGuiViewport).Flags = 5;
  (pIVar12->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar12->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar12->super_ImGuiViewport).Size = (pIVar38->IO).DisplaySize;
  for (; iVar40 < pIVar1->Size; iVar40 = iVar40 + 1) {
    ppIVar26 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,iVar40);
    pIVar12 = *ppIVar26;
    pIVar12->WorkOffsetMin = pIVar12->BuildWorkOffsetMin;
    pIVar12->WorkOffsetMax = pIVar12->BuildWorkOffsetMax;
    (pIVar12->BuildWorkOffsetMin).x = 0.0;
    (pIVar12->BuildWorkOffsetMin).y = 0.0;
    (pIVar12->BuildWorkOffsetMax).x = 0.0;
    (pIVar12->BuildWorkOffsetMax).y = 0.0;
    ImGuiViewportP::UpdateWorkRect(pIVar12);
  }
  ((pIVar15->IO).Fonts)->Locked = true;
  font = GetDefaultFont();
  SetCurrentFont(font);
  if (pIVar15->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0xf68,"void ImGui::NewFrame()");
  }
  pIVar1 = &pIVar15->Viewports;
  fVar57 = 3.4028235e+38;
  fVar58 = 3.4028235e+38;
  fVar50 = -3.4028235e+38;
  fVar49 = -3.4028235e+38;
  for (iVar39 = 0; iVar39 < pIVar1->Size; iVar39 = iVar39 + 1) {
    ppIVar26 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,iVar39);
    IVar66 = ImGuiViewportP::GetMainRect(*ppIVar26);
    fVar59 = IVar66.Min.x;
    if (fVar57 <= IVar66.Min.x) {
      fVar59 = fVar57;
    }
    fVar57 = fVar59;
    fVar59 = IVar66.Min.y;
    if (fVar58 <= IVar66.Min.y) {
      fVar59 = fVar58;
    }
    fVar58 = fVar59;
    fVar59 = IVar66.Max.x;
    if (IVar66.Max.x <= fVar50) {
      fVar59 = fVar50;
    }
    fVar50 = fVar59;
    if (fVar49 < IVar66.Max.y) {
      fVar49 = IVar66.Max.y;
    }
  }
  (pIVar15->DrawListSharedData).ClipRectFullscreen.x = fVar57;
  (pIVar15->DrawListSharedData).ClipRectFullscreen.y = fVar58;
  (pIVar15->DrawListSharedData).ClipRectFullscreen.z = fVar50;
  (pIVar15->DrawListSharedData).ClipRectFullscreen.w = fVar49;
  fVar49 = (pIVar15->Style).CircleTessellationMaxError;
  (pIVar15->DrawListSharedData).CurveTessellationTol = (pIVar15->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&pIVar15->DrawListSharedData,fVar49);
  bVar17 = (pIVar15->Style).AntiAliasedLines;
  uVar47 = (uint)bVar17;
  (pIVar15->DrawListSharedData).InitialFlags = (uint)bVar17;
  if (((pIVar15->Style).AntiAliasedLinesUseTex != false) &&
     ((pIVar15->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar47 = bVar17 | 2;
    (pIVar15->DrawListSharedData).InitialFlags = uVar47;
  }
  if ((pIVar15->Style).AntiAliasedFill == true) {
    uVar47 = uVar47 | 4;
    (pIVar15->DrawListSharedData).InitialFlags = uVar47;
  }
  if (((pIVar15->IO).BackendFlags & 8) != 0) {
    (pIVar15->DrawListSharedData).InitialFlags = uVar47 | 8;
  }
  for (iVar39 = 0; iVar39 < pIVar1->Size; iVar39 = iVar39 + 1) {
    ppIVar26 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,iVar39);
    pIVar12 = *ppIVar26;
    (pIVar12->DrawDataP).Valid = false;
    *(undefined3 *)&(pIVar12->DrawDataP).field_0x1 = 0;
    (pIVar12->DrawDataP).CmdListsCount = 0;
    (pIVar12->DrawDataP).TotalIdxCount = 0;
    (pIVar12->DrawDataP).TotalVtxCount = 0;
    (pIVar12->DrawDataP).CmdLists = (ImDrawList **)0x0;
    (pIVar12->DrawDataP).DisplayPos.x = 0.0;
    (pIVar12->DrawDataP).DisplayPos.y = 0.0;
    (pIVar12->DrawDataP).DisplaySize.x = 0.0;
    (pIVar12->DrawDataP).DisplaySize.y = 0.0;
    (pIVar12->DrawDataP).FramebufferScale.x = 0.0;
    (pIVar12->DrawDataP).FramebufferScale.y = 0.0;
  }
  if ((pIVar15->DragDropActive != false) &&
     (IVar33 = (pIVar15->DragDropPayload).SourceId, IVar33 == pIVar15->ActiveId)) {
    KeepAliveID(IVar33);
  }
  if (pIVar15->HoveredIdPreviousFrame == 0) {
    IVar33 = pIVar15->HoveredId;
    pIVar15->HoveredIdTimer = 0.0;
    pIVar15->HoveredIdNotActiveTimer = 0.0;
    if (IVar33 == 0) goto LAB_0013b953;
LAB_0013b928:
    fVar49 = (pIVar15->IO).DeltaTime;
    pIVar15->HoveredIdTimer = pIVar15->HoveredIdTimer + fVar49;
    IVar21 = IVar33;
    if (pIVar15->ActiveId != IVar33) {
      pIVar15->HoveredIdNotActiveTimer = fVar49 + pIVar15->HoveredIdNotActiveTimer;
      IVar21 = pIVar15->ActiveId;
    }
  }
  else {
    IVar33 = pIVar15->HoveredId;
    if (IVar33 != 0) {
      if (pIVar15->ActiveId == IVar33) {
        pIVar15->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_0013b928;
    }
LAB_0013b953:
    IVar33 = 0;
    IVar21 = pIVar15->ActiveId;
  }
  pIVar15->HoveredIdPreviousFrame = IVar33;
  pIVar15->HoveredIdPreviousFrameUsingMouseWheel = pIVar15->HoveredIdUsingMouseWheel;
  pIVar15->HoveredId = 0;
  pIVar15->HoveredIdAllowOverlap = false;
  pIVar15->HoveredIdUsingMouseWheel = false;
  pIVar15->HoveredIdDisabled = false;
  if (((pIVar15->ActiveIdIsAlive != IVar21) && (IVar21 != 0)) &&
     (pIVar15->ActiveIdPreviousFrame == IVar21)) {
    ClearActiveID();
    IVar21 = pIVar15->ActiveId;
  }
  fVar49 = (pIVar15->IO).DeltaTime;
  if (IVar21 != 0) {
    pIVar15->ActiveIdTimer = pIVar15->ActiveIdTimer + fVar49;
  }
  pIVar15->LastActiveIdTimer = pIVar15->LastActiveIdTimer + fVar49;
  pIVar15->ActiveIdPreviousFrame = IVar21;
  pIVar15->ActiveIdPreviousFrameWindow = pIVar15->ActiveIdWindow;
  pIVar15->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar15->ActiveIdHasBeenEditedBefore;
  pIVar15->ActiveIdIsAlive = 0;
  pIVar15->ActiveIdHasBeenEditedThisFrame = false;
  pIVar15->ActiveIdPreviousFrameIsAlive = false;
  pIVar15->ActiveIdIsJustActivated = false;
  if (pIVar15->TempInputId == 0) {
LAB_0013ba4f:
    if (IVar21 == 0) {
      pIVar15->ActiveIdUsingNavDirMask = 0;
      pIVar15->ActiveIdUsingNavInputMask = 0;
      pIVar15->ActiveIdUsingKeyInputMask = 0;
    }
  }
  else if (IVar21 != pIVar15->TempInputId) {
    pIVar15->TempInputId = 0;
    goto LAB_0013ba4f;
  }
  pIVar15->DragDropAcceptIdPrev = pIVar15->DragDropAcceptIdCurr;
  pIVar15->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar15->DragDropAcceptIdCurr = 0;
  pIVar15->DragDropWithinSource = false;
  pIVar15->DragDropWithinTarget = false;
  pIVar15->DragDropHoldJustPressedId = 0;
  IVar22 = GetMergedKeyModFlags();
  (pIVar15->IO).KeyMods = IVar22;
  memcpy((pIVar15->IO).KeysDownDurationPrev,(pIVar15->IO).KeysDownDuration,0x800);
  for (lVar25 = 0x144; pIVar38 = GImGui, lVar25 != 0x344; lVar25 = lVar25 + 1) {
    fVar57 = -1.0;
    if (*(char *)((long)(pIVar15->IO).KeyMap + lVar25 + -0x3c) == '\x01') {
      fVar58 = *(float *)((long)pIVar15 + lVar25 * 4 + -0x70);
      fVar57 = 0.0;
      if (0.0 <= fVar58) {
        fVar57 = fVar58 + fVar49;
      }
    }
    *(float *)((long)pIVar15 + lVar25 * 4 + -0x70) = fVar57;
  }
  (GImGui->IO).WantSetMousePos = false;
  pIVar38->NavWrapRequestWindow = (ImGuiWindow *)0x0;
  pIVar38->NavWrapRequestFlags = 0;
  uVar47 = (pIVar38->IO).ConfigFlags;
  if (((uVar47 & 2) == 0) || (((pIVar38->IO).BackendFlags & 1) == 0)) {
    bVar14 = 0;
  }
  else {
    bVar14 = 1;
    if ((pIVar38->NavInputSource != ImGuiInputSource_Gamepad) &&
       (((0.0 < (pIVar38->IO).NavInputs[0] || (0.0 < (pIVar38->IO).NavInputs[2])) ||
        ((0.0 < (pIVar38->IO).NavInputs[1] ||
         ((((0.0 < (pIVar38->IO).NavInputs[3] || (0.0 < (pIVar38->IO).NavInputs[4])) ||
           (0.0 < (pIVar38->IO).NavInputs[5])) ||
          ((0.0 < (pIVar38->IO).NavInputs[6] || (0.0 < (pIVar38->IO).NavInputs[7])))))))))) {
      pIVar38->NavInputSource = ImGuiInputSource_Gamepad;
    }
  }
  if ((uVar47 & 1) != 0) {
    bVar17 = IsKeyDown((pIVar38->IO).KeyMap[0xc]);
    if (bVar17) {
      (pIVar38->IO).NavInputs[0] = 1.0;
      pIVar38->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar17 = IsKeyDown((pIVar38->IO).KeyMap[0xd]);
    if (bVar17) {
      (pIVar38->IO).NavInputs[2] = 1.0;
      pIVar38->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar17 = IsKeyDown((pIVar38->IO).KeyMap[0xe]);
    if (bVar17) {
      (pIVar38->IO).NavInputs[1] = 1.0;
      pIVar38->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar17 = IsKeyDown((pIVar38->IO).KeyMap[1]);
    if (bVar17) {
      (pIVar38->IO).NavInputs[0x11] = 1.0;
      pIVar38->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar17 = IsKeyDown((pIVar38->IO).KeyMap[2]);
    if (bVar17) {
      (pIVar38->IO).NavInputs[0x12] = 1.0;
      pIVar38->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar17 = IsKeyDown((pIVar38->IO).KeyMap[3]);
    if (bVar17) {
      (pIVar38->IO).NavInputs[0x13] = 1.0;
      pIVar38->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar17 = IsKeyDown((pIVar38->IO).KeyMap[4]);
    if (bVar17) {
      (pIVar38->IO).NavInputs[0x14] = 1.0;
      pIVar38->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar17 = (pIVar38->IO).KeyCtrl;
    if (bVar17 == true) {
      (pIVar38->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar38->IO).KeyShift == true) {
      (pIVar38->IO).NavInputs[0xf] = 1.0;
    }
    if (((bVar17 == false) && ((pIVar38->IO).KeyAlt != false)) &&
       (((pIVar38->IO).NavInputs[0x10] = 1.0, pIVar38->NavWindowingToggleLayer == true &&
        (0 < (pIVar38->IO).InputQueueCharacters.Size)))) {
      pIVar38->NavWindowingToggleLayer = false;
    }
  }
  pfVar30 = (pIVar38->IO).NavInputsDownDuration;
  pfVar41 = pfVar30;
  pfVar44 = (pIVar38->IO).NavInputsDownDurationPrev;
  for (lVar25 = 0x15; lVar25 != 0; lVar25 = lVar25 + -1) {
    *pfVar44 = *pfVar41;
    pfVar41 = pfVar41 + (ulong)bVar46 * -2 + 1;
    pfVar44 = pfVar44 + (ulong)bVar46 * -2 + 1;
  }
  for (lVar25 = 0; pIVar16 = GImGui, lVar25 != 0x15; lVar25 = lVar25 + 1) {
    fVar49 = -1.0;
    if (0.0 < (pIVar38->IO).NavInputs[lVar25]) {
      fVar49 = 0.0;
      if (0.0 <= pfVar30[lVar25]) {
        fVar49 = pfVar30[lVar25] + (pIVar38->IO).DeltaTime;
      }
    }
    pfVar30[lVar25] = fVar49;
  }
  if (((pIVar38->NavInitResultId != 0) && (GImGui->NavWindow != (ImGuiWindow *)0x0)) &&
     (SetNavID(GImGui->NavInitResultId,GImGui->NavLayer,0,&GImGui->NavInitResultRectRel),
     pIVar16->NavInitRequestFromMove == true)) {
    pIVar16->NavMousePosDirty = true;
    pIVar16->NavDisableHighlight = false;
    pIVar16->NavDisableMouseHover = true;
  }
  pIVar38->NavInitRequest = false;
  pIVar38->NavInitRequestFromMove = false;
  pIVar38->NavInitResultId = 0;
  pIVar38->NavJustMovedToId = 0;
  pIVar16 = GImGui;
  if (pIVar38->NavMoveRequest == true) {
    IVar33 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar33 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId == 0) goto LAB_0013bfef;
      GImGui->NavDisableHighlight = false;
    }
    else {
      pIVar2 = &GImGui->NavMoveResultOther;
      pIVar45 = &GImGui->NavMoveResultLocal;
      if (IVar33 == 0) {
        pIVar45 = pIVar2;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar33 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar33 != 0)) &&
         (IVar33 != GImGui->NavId)) {
        pIVar45 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (pIVar45 == pIVar2) {
LAB_0013be3b:
        pIVar45 = pIVar2;
      }
      else if (((GImGui->NavMoveResultOther).ID != 0) &&
              (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar49 = (GImGui->NavMoveResultOther).DistBox;
        fVar57 = pIVar45->DistBox;
        if (fVar57 <= fVar49) {
          if (((fVar49 != fVar57) || (NAN(fVar49) || NAN(fVar57))) ||
             (pfVar30 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar45->DistCenter < *pfVar30 || pIVar45->DistCenter == *pfVar30)) goto LAB_0013be3e;
        }
        goto LAB_0013be3b;
      }
LAB_0013be3e:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
         (pIVar27 = pIVar45->Window, pIVar27 == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                      ,0x248a,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        if ((GImGui->NavMoveRequestFlags & 0x40U) == 0) {
          IVar51 = (pIVar45->RectRel).Min;
          IVar52 = (pIVar45->RectRel).Max;
          fVar49 = (pIVar27->Pos).x;
          fVar57 = (pIVar27->Pos).y;
          local_58.Max.x = IVar52.x + fVar49;
          local_58.Max.y = IVar52.y + fVar57;
          local_58.Min.y = IVar51.y + fVar57;
          local_58.Min.x = IVar51.x + fVar49;
          IVar51 = ScrollToBringRectIntoView(pIVar45->Window,&local_58);
        }
        else {
          fVar49 = 0.0;
          if (GImGui->NavMoveDir == 2) {
            fVar49 = (pIVar27->ScrollMax).y;
          }
          (pIVar27->ScrollTarget).y = fVar49;
          (pIVar27->ScrollTargetCenterRatio).y = 0.0;
          IVar51 = (ImVec2)((ulong)(uint)((pIVar27->Scroll).y - fVar49) << 0x20);
          (pIVar27->ScrollTargetEdgeSnapDist).y = 0.0;
        }
        fVar49 = (pIVar45->RectRel).Min.y;
        fVar57 = (pIVar45->RectRel).Max.x;
        fVar58 = (pIVar45->RectRel).Max.y;
        (pIVar45->RectRel).Min.x = (pIVar45->RectRel).Min.x - IVar51.x;
        (pIVar45->RectRel).Min.y = fVar49 - IVar51.y;
        (pIVar45->RectRel).Max.x = fVar57 - IVar51.x;
        (pIVar45->RectRel).Max.y = fVar58 - IVar51.y;
      }
      ClearActiveID();
      pIVar16->NavWindow = pIVar45->Window;
      IVar33 = pIVar45->ID;
      if (pIVar16->NavId == IVar33) {
        IVar21 = pIVar45->FocusScopeId;
      }
      else {
        pIVar16->NavJustMovedToId = IVar33;
        IVar21 = pIVar45->FocusScopeId;
        pIVar16->NavJustMovedToFocusScopeId = IVar21;
        pIVar16->NavJustMovedToKeyMods = pIVar16->NavMoveRequestKeyMods;
      }
      SetNavID(IVar33,pIVar16->NavLayer,IVar21,&pIVar45->RectRel);
      pIVar16->NavMousePosDirty = true;
      pIVar16->NavDisableHighlight = false;
    }
    pIVar16->NavDisableMouseHover = true;
  }
LAB_0013bfef:
  if (pIVar38->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar38->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x2389,"void ImGui::NavUpdate()");
    }
    if (((pIVar38->NavMoveResultLocal).ID == 0) && ((pIVar38->NavMoveResultOther).ID == 0)) {
      pIVar38->NavDisableHighlight = false;
    }
    pIVar38->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar38->NavMousePosDirty == true) && (pIVar38->NavIdIsAlive == true)) {
    if ((((pIVar38->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar38->IO).BackendFlags & 4) != 0 && (pIVar38->NavDisableHighlight == false)) &&
         (pIVar38->NavDisableMouseHover == true)) && (pIVar38->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar51 = NavCalcPreferredRefPos();
      (pIVar38->IO).MousePosPrev = IVar51;
      (pIVar38->IO).MousePos = IVar51;
      (pIVar38->IO).WantSetMousePos = true;
    }
    pIVar38->NavMousePosDirty = false;
  }
  pIVar38->NavIdIsAlive = false;
  pIVar38->NavJustTabbedId = 0;
  IVar43 = pIVar38->NavLayer;
  if (ImGuiNavLayer_Menu < IVar43) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x239d,"void ImGui::NavUpdate()");
  }
  pIVar27 = pIVar38->NavWindow;
  pIVar35 = pIVar27;
  if (pIVar27 != (ImGuiWindow *)0x0) {
    for (; pIVar35 != (ImGuiWindow *)0x0; pIVar35 = pIVar35->ParentWindow) {
      if ((pIVar35->RootWindow == pIVar35) || ((pIVar35->Flags & 0x14000000) != 0)) {
        if (pIVar35 != pIVar27) {
          pIVar35->NavLastChildNavWindow = pIVar27;
        }
        break;
      }
    }
    if ((IVar43 == ImGuiNavLayer_Main) && (pIVar27->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar27->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar16 = GImGui;
  local_38 = pIVar15;
  pIVar27 = GetTopMostPopupModal();
  if (pIVar27 != (ImGuiWindow *)0x0) {
    pIVar16->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar16->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar49 = (pIVar16->IO).DeltaTime * -10.0 + pIVar16->NavWindowingHighlightAlpha;
    fVar49 = (float)(-(uint)(0.0 <= fVar49) & (uint)fVar49);
    pIVar16->NavWindowingHighlightAlpha = fVar49;
    if ((pIVar16->DimBgRatio <= 0.0) && (fVar49 <= 0.0)) {
      pIVar16->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar27 == (ImGuiWindow *)0x0) && (pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    bVar17 = IsNavInputTest(3,ImGuiInputReadMode_Pressed);
    if ((pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0) &&
       (((pIVar16->IO).KeyCtrl == true && (bVar18 = IsKeyPressedMap(0,true), bVar18)))) {
      bVar46 = (byte)(pIVar16->IO).ConfigFlags;
      IVar36 = (ImGuiInputSource)bVar46;
      if (bVar17 || (bVar46 & 1) != 0) {
LAB_0013c1fe:
        pIVar27 = pIVar16->NavWindow;
        if ((pIVar27 != (ImGuiWindow *)0x0) ||
           (pIVar27 = FindWindowNavFocusable((pIVar16->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
           pIVar27 != (ImGuiWindow *)0x0)) {
          pIVar27 = pIVar27->RootWindow;
          pIVar16->NavWindowingTargetAnim = pIVar27;
          pIVar16->NavWindowingTarget = pIVar27;
          pIVar16->NavWindowingTimer = 0.0;
          pIVar16->NavWindowingHighlightAlpha = 0.0;
          pIVar16->NavWindowingToggleLayer = (bool)(~(byte)IVar36 & 1);
          pIVar16->NavInputSource = IVar36 & ImGuiInputSource_Mouse ^ ImGuiInputSource_Gamepad;
        }
      }
    }
    else if (bVar17) {
      IVar36 = ImGuiInputSource_None;
      goto LAB_0013c1fe;
    }
  }
  fVar49 = (pIVar16->IO).DeltaTime + pIVar16->NavWindowingTimer;
  pIVar16->NavWindowingTimer = fVar49;
  if (pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0) {
LAB_0013c3d7:
    bVar17 = false;
    pIVar27 = (ImGuiWindow *)0x0;
  }
  else {
    IVar36 = pIVar16->NavInputSource;
    if (IVar36 != ImGuiInputSource_Gamepad) {
LAB_0013c353:
      if (IVar36 == ImGuiInputSource_Keyboard) {
        fVar57 = (pIVar16->NavWindowingTimer + -0.2) / 0.05;
        fVar49 = 1.0;
        if (fVar57 <= 1.0) {
          fVar49 = fVar57;
        }
        fVar49 = (float)(~-(uint)(fVar57 < 0.0) & (uint)fVar49);
        uVar48 = -(uint)(fVar49 <= pIVar16->NavWindowingHighlightAlpha);
        pIVar16->NavWindowingHighlightAlpha =
             (float)(uVar48 & (uint)pIVar16->NavWindowingHighlightAlpha | ~uVar48 & (uint)fVar49);
        bVar17 = IsKeyPressedMap(0,true);
        if (bVar17) {
          NavUpdateWindowingHighlightWindow((pIVar16->IO).KeyShift - 1 | 1);
        }
        if ((pIVar16->IO).KeyCtrl == false) {
          pIVar27 = pIVar16->NavWindowingTarget;
          bVar17 = false;
          goto LAB_0013c3dd;
        }
      }
      goto LAB_0013c3d7;
    }
    fVar57 = (fVar49 + -0.2) / 0.05;
    fVar49 = 1.0;
    if (fVar57 <= 1.0) {
      fVar49 = fVar57;
    }
    fVar49 = (float)(~-(uint)(fVar57 < 0.0) & (uint)fVar49);
    uVar48 = -(uint)(fVar49 <= pIVar16->NavWindowingHighlightAlpha);
    pIVar16->NavWindowingHighlightAlpha =
         (float)(uVar48 & (uint)pIVar16->NavWindowingHighlightAlpha | ~uVar48 & (uint)fVar49);
    bVar17 = IsNavInputTest(0xc,ImGuiInputReadMode_RepeatSlow);
    bVar18 = IsNavInputTest(0xd,ImGuiInputReadMode_RepeatSlow);
    if ((uint)bVar17 - (uint)bVar18 != 0) {
      NavUpdateWindowingHighlightWindow((uint)bVar17 - (uint)bVar18);
      pIVar16->NavWindowingHighlightAlpha = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) {
      if (pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_0013c3d7;
      IVar36 = pIVar16->NavInputSource;
      goto LAB_0013c353;
    }
    pbVar37 = &pIVar16->NavWindowingToggleLayer;
    *pbVar37 = (bool)(*pbVar37 &
                     (pIVar16->NavWindowingHighlightAlpha <= 1.0 &&
                     pIVar16->NavWindowingHighlightAlpha != 1.0));
    if (*pbVar37 == false) {
      pIVar27 = pIVar16->NavWindowingTarget;
      bVar17 = false;
    }
    else {
      bVar17 = pIVar16->NavWindow != (ImGuiWindow *)0x0;
      pIVar27 = (ImGuiWindow *)0x0;
    }
    pIVar16->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_0013c3dd:
  dir_sources = 1;
  bVar18 = IsNavInputTest(0x10,ImGuiInputReadMode_Pressed);
  if (bVar18) {
    pIVar16->NavWindowingToggleLayer = true;
  }
  if ((((pIVar16->ActiveId == 0) || (pIVar16->ActiveIdAllowOverlap == true)) &&
      (pIVar16->NavWindowingToggleLayer == true)) &&
     (bVar18 = IsNavInputTest(0x10,ImGuiInputReadMode_Released), bVar18)) {
    bVar18 = IsMousePosValid(&(pIVar16->IO).MousePos);
    bVar19 = IsMousePosValid(&(pIVar16->IO).MousePosPrev);
    bVar17 = (bool)(bVar19 == bVar18 | bVar17);
  }
  pIVar35 = pIVar16->NavWindowingTarget;
  if ((pIVar35 != (ImGuiWindow *)0x0) && ((pIVar35->Flags & 4) == 0)) {
    if (pIVar16->NavInputSource == ImGuiInputSource_Gamepad) {
      dir_sources = 4;
LAB_0013c4bc:
      IVar51 = GetNavInputAmount2d(dir_sources,ImGuiInputReadMode_Down,0.0,0.0);
    }
    else {
      IVar51.x = 0.0;
      IVar51.y = 0.0;
      if ((pIVar16->NavInputSource == ImGuiInputSource_Keyboard) &&
         ((pIVar16->IO).KeyShift == false)) goto LAB_0013c4bc;
    }
    fVar49 = IVar51.x;
    fVar57 = IVar51.y;
    if ((((fVar49 != 0.0) || (NAN(fVar49))) || (fVar57 != 0.0)) || (NAN(fVar57))) {
      fVar58 = (pIVar16->IO).DisplayFramebufferScale.x;
      fVar50 = (pIVar16->IO).DisplayFramebufferScale.y;
      if (fVar50 <= fVar58) {
        fVar58 = fVar50;
      }
      fVar58 = (float)(int)(fVar58 * (pIVar16->IO).DeltaTime * 800.0);
      pIVar35 = pIVar35->RootWindow;
      local_58.Min.y = (pIVar35->Pos).y + fVar57 * fVar58;
      local_58.Min.x = (pIVar35->Pos).x + fVar49 * fVar58;
      SetWindowPos(pIVar35,&local_58.Min,1);
      MarkIniSettingsDirty(pIVar35);
      pIVar16->NavDisableMouseHover = true;
    }
  }
  if (pIVar27 != (ImGuiWindow *)0x0) {
    if ((pIVar16->NavWindow == (ImGuiWindow *)0x0) || (pIVar27 != pIVar16->NavWindow->RootWindow)) {
      ClearActiveID();
      pIVar16->NavDisableHighlight = false;
      pIVar16->NavDisableMouseHover = true;
      pIVar35 = pIVar27->NavLastChildNavWindow;
      if ((pIVar35 == (ImGuiWindow *)0x0) || (pIVar35->WasActive == false)) {
        pIVar35 = pIVar27;
      }
      ClosePopupsOverWindow(pIVar35,false);
      FocusWindow(pIVar35);
      if (pIVar35->NavLastIds[0] == 0) {
        NavInitWindow(pIVar35,false);
      }
      if ((pIVar35->DC).NavLayersActiveMaskNext == 2) {
        pIVar16->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar16->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar17) && (pIVar16->NavWindow != (ImGuiWindow *)0x0)) {
    ClearActiveID();
    pIVar27 = pIVar16->NavWindow;
    pIVar35 = pIVar27;
    do {
      window = pIVar35;
      if ((window->ParentWindow == (ImGuiWindow *)0x0) ||
         (((window->DC).NavLayersActiveMask & 2) != 0)) break;
      pIVar35 = window->ParentWindow;
    } while ((window->Flags & 0x15000000U) == 0x1000000);
    if (window != pIVar27) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar27;
      pIVar27 = pIVar16->NavWindow;
    }
    pIVar16->NavDisableHighlight = false;
    pIVar16->NavDisableMouseHover = true;
    IVar43 = ImGuiNavLayer_Main;
    if (((pIVar27->DC).NavLayersActiveMask & 2) != 0) {
      if (pIVar16->NavLayer == ImGuiNavLayer_Main) {
        pIVar27->NavLastIds[1] = 0;
        IVar43 = ImGuiNavLayer_Menu;
      }
      else {
        IVar43 = pIVar16->NavLayer ^ ImGuiNavLayer_Menu;
      }
    }
    NavRestoreLayer(IVar43);
  }
  if (((bool)((uVar47 & 1) == 0 & (bVar14 ^ 1))) || (pIVar38->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar38->IO).NavActive = false;
LAB_0013c717:
    bVar17 = pIVar38->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar17 = (pIVar38->NavWindow->Flags & 0x40000U) == 0;
    (pIVar38->IO).NavActive = bVar17;
    if (((!bVar17) || (pIVar38->NavId == 0)) ||
       (bVar17 = true, pIVar38->NavDisableHighlight != false)) goto LAB_0013c717;
  }
  (pIVar38->IO).NavVisible = bVar17;
  bVar17 = IsNavInputTest(1,ImGuiInputReadMode_Pressed);
  if (bVar17) {
    if (pIVar38->ActiveId == 0) {
      if (pIVar38->NavLayer == ImGuiNavLayer_Main) {
        pIVar27 = pIVar38->NavWindow;
        if (pIVar27 == (ImGuiWindow *)0x0) {
          if (0 < (pIVar38->OpenPopupStack).Size) goto LAB_0013cc56;
LAB_0013cd06:
          pIVar38->NavId = 0;
          pIVar38->NavFocusScopeId = 0;
        }
        else if (((pIVar27 == pIVar27->RootWindow) || ((pIVar27->Flags & 0x4000000) != 0)) ||
                (pIVar35 = pIVar27->ParentWindow, pIVar35 == (ImGuiWindow *)0x0)) {
          if ((pIVar38->OpenPopupStack).Size < 1) {
            if ((pIVar27->Flags & 0x5000000U) != 0x1000000) {
              pIVar27->NavLastIds[0] = 0;
            }
            goto LAB_0013cd06;
          }
LAB_0013cc56:
          pIVar28 = ImVector<ImGuiPopupData>::back(&pIVar38->OpenPopupStack);
          if ((pIVar28->Window->Flags & 0x8000000) == 0) {
            ClosePopupToLevel((pIVar38->OpenPopupStack).Size + -1,true);
          }
        }
        else {
          if (pIVar27->ChildId == 0) {
            __assert_fail("child_window->ChildId != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                          ,0x23bf,"void ImGui::NavUpdate()");
          }
          IVar66 = ImGuiWindow::Rect(pIVar27);
          local_48 = IVar66.Min;
          FocusWindow(pIVar35);
          fVar49 = (pIVar35->Pos).x;
          fVar57 = (pIVar35->Pos).y;
          local_68 = IVar66.Max.x;
          fStack_64 = IVar66.Max.y;
          local_58.Max.x = local_68 - fVar49;
          local_58.Max.y = fStack_64 - fVar57;
          local_58.Min.y = local_48.y - fVar57;
          local_58.Min.x = local_48.x - fVar49;
          SetNavID(pIVar27->ChildId,ImGuiNavLayer_Main,0,&local_58);
        }
      }
      else {
        NavRestoreLayer(ImGuiNavLayer_Main);
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
  pIVar38->NavActivateId = 0;
  pIVar38->NavActivateDownId = 0;
  pIVar38->NavActivatePressedId = 0;
  pIVar38->NavInputId = 0;
  if (((pIVar38->NavId == 0) || (pIVar38->NavDisableHighlight != false)) ||
     (pIVar38->NavWindowingTarget != (ImGuiWindow *)0x0)) {
LAB_0013c7a7:
    pIVar27 = pIVar38->NavWindow;
    if (pIVar27 == (ImGuiWindow *)0x0) goto LAB_0013c810;
    if ((pIVar27->Flags & 0x40000) != 0) {
      pIVar38->NavDisableHighlight = true;
    }
    bVar17 = false;
  }
  else {
    if (pIVar38->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar38->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          bVar17 = IsNavInputTest(0,ImGuiInputReadMode_Pressed);
          IVar33 = pIVar38->ActiveId;
          IVar21 = pIVar38->NavId;
          if (IVar33 == 0 && bVar17) {
            pIVar38->NavActivateId = IVar21;
            pIVar38->NavActivateDownId = IVar21;
LAB_0013ccbb:
            pIVar38->NavActivatePressedId = IVar21;
          }
          else if (IVar33 == 0) {
            pIVar38->NavActivateDownId = IVar21;
            if (bVar17) goto LAB_0013ccbb;
          }
          else {
            bVar18 = IVar33 == IVar21;
            if (!bVar18) goto LAB_0013c7a7;
            pIVar38->NavActivateDownId = IVar33;
            IVar21 = IVar33;
            if (bVar17 && bVar18) goto LAB_0013ccbb;
          }
LAB_0013ccc3:
          bVar17 = IsNavInputTest(2,ImGuiInputReadMode_Pressed);
          if (bVar17) {
            pIVar38->NavInputId = pIVar38->NavId;
          }
        }
        else if (pIVar38->ActiveId == pIVar38->NavId || pIVar38->ActiveId == 0) goto LAB_0013ccc3;
      }
      goto LAB_0013c7a7;
    }
LAB_0013c810:
    bVar17 = true;
    pIVar27 = (ImGuiWindow *)0x0;
  }
  IVar33 = pIVar38->NavActivateId;
  if ((IVar33 != 0) && (pIVar38->NavActivateDownId != IVar33)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x23e5,"void ImGui::NavUpdate()");
  }
  pIVar38->NavMoveRequest = false;
  IVar33 = pIVar38->NavNextActivateId;
  if (IVar33 != 0) {
    pIVar38->NavActivateId = IVar33;
    pIVar38->NavActivateDownId = IVar33;
    pIVar38->NavActivatePressedId = IVar33;
    pIVar38->NavInputId = IVar33;
  }
  pIVar38->NavNextActivateId = 0;
  if (pIVar38->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar38->NavMoveDir = -1;
    pIVar38->NavMoveRequestFlags = 0;
    if (((!bVar17) && (pIVar38->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar27->Flags & 0x40000) == 0)) {
      if (((GImGui->ActiveIdUsingNavDirMask & 1) == 0) &&
         ((bVar17 = IsNavInputTest(4,ImGuiInputReadMode_Repeat), bVar17 ||
          (bVar17 = IsNavInputTest(0x11,ImGuiInputReadMode_Repeat), bVar17)))) {
        pIVar38->NavMoveDir = 0;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 2) == 0) &&
         ((bVar17 = IsNavInputTest(5,ImGuiInputReadMode_Repeat), bVar17 ||
          (bVar17 = IsNavInputTest(0x12,ImGuiInputReadMode_Repeat), bVar17)))) {
        pIVar38->NavMoveDir = 1;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 4) == 0) &&
         ((bVar17 = IsNavInputTest(6,ImGuiInputReadMode_Repeat), bVar17 ||
          (bVar17 = IsNavInputTest(0x13,ImGuiInputReadMode_Repeat), bVar17)))) {
        pIVar38->NavMoveDir = 2;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 8) == 0) &&
         ((bVar17 = IsNavInputTest(7,ImGuiInputReadMode_Repeat), bVar17 ||
          (bVar17 = IsNavInputTest(0x14,ImGuiInputReadMode_Repeat), bVar17)))) {
        pIVar38->NavMoveDir = 3;
      }
    }
    pIVar38->NavMoveClipDir = pIVar38->NavMoveDir;
  }
  else {
    if ((pIVar38->NavMoveDir == -1) || (pIVar38->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x2400,"void ImGui::NavUpdate()");
    }
    if (pIVar38->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x2401,"void ImGui::NavUpdate()");
    }
    pIVar38->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar15 = GImGui;
  fVar49 = 0.0;
  if ((((((uVar47 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
       (pIVar27 = GImGui->NavWindow, pIVar27 != (ImGuiWindow *)0x0)) &&
      (((pIVar27->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    bVar17 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar19 = false;
    bVar18 = false;
    if (bVar17) {
      bVar18 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    bVar17 = IsKeyDown((pIVar15->IO).KeyMap[6]);
    if (bVar17) {
      bVar19 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar17 = IsKeyPressed((pIVar15->IO).KeyMap[7],true);
    if (bVar17) {
      bVar17 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar17 = false;
    }
    bVar20 = IsKeyPressed((pIVar15->IO).KeyMap[8],true);
    if (bVar20) {
      bVar20 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar20 = false;
    }
    fVar49 = 0.0;
    if ((bVar18 != bVar19) || (bVar17 != bVar20)) {
      if (((pIVar27->DC).NavLayersActiveMask == 0) && ((pIVar27->DC).NavHasScroll == true)) {
        bVar18 = IsKeyPressed((pIVar15->IO).KeyMap[5],true);
        if (bVar18) {
          fVar49 = (pIVar27->Scroll).y - ((pIVar27->InnerRect).Max.y - (pIVar27->InnerRect).Min.y);
LAB_0013de79:
          (pIVar27->ScrollTarget).y = fVar49;
        }
        else {
          bVar18 = IsKeyPressed((pIVar15->IO).KeyMap[6],true);
          if (bVar18) {
            fVar49 = ((pIVar27->InnerRect).Max.y - (pIVar27->InnerRect).Min.y) + (pIVar27->Scroll).y
            ;
            goto LAB_0013de79;
          }
          if (bVar17 == false) {
            if (bVar20 == false) goto LAB_0013de8c;
            fVar49 = (pIVar27->ScrollMax).y;
            goto LAB_0013de79;
          }
          (pIVar27->ScrollTarget).y = 0.0;
        }
        (pIVar27->ScrollTargetCenterRatio).y = 0.0;
        (pIVar27->ScrollTargetEdgeSnapDist).y = 0.0;
LAB_0013de8c:
        fVar49 = 0.0;
      }
      else {
        IVar43 = pIVar15->NavLayer;
        fVar49 = (pIVar27->InnerRect).Max.y;
        fVar57 = (pIVar27->InnerRect).Min.y;
        fVar58 = ImGuiWindow::CalcFontSize(pIVar27);
        fVar49 = (pIVar27->NavRectRel[IVar43].Max.y - pIVar27->NavRectRel[IVar43].Min.y) +
                 ((fVar49 - fVar57) - fVar58);
        fVar49 = (float)(~-(uint)(fVar49 <= 0.0) & (uint)fVar49);
        bVar18 = IsKeyPressed((pIVar15->IO).KeyMap[5],true);
        if (bVar18) {
          fVar49 = -fVar49;
          pIVar15->NavMoveDir = 3;
          pIVar15->NavMoveClipDir = 2;
          pIVar15->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar18 = IsKeyPressed((pIVar15->IO).KeyMap[6],true);
          if (!bVar18) {
            pIVar32 = pIVar27->NavRectRel + IVar43;
            if (bVar17 == false) {
              fVar49 = 0.0;
              if (bVar20 != false) {
                fVar57 = ((pIVar27->ScrollMax).y + (pIVar27->SizeFull).y) - (pIVar27->Scroll).y;
                pIVar27->NavRectRel[IVar43].Max.y = fVar57;
                pIVar27->NavRectRel[IVar43].Min.y = fVar57;
                fVar57 = (pIVar32->Min).x;
                pIVar3 = &pIVar27->NavRectRel[IVar43].Max;
                if (pIVar3->x <= fVar57 && fVar57 != pIVar3->x) {
                  pIVar27->NavRectRel[IVar43].Max.x = 0.0;
                  (pIVar32->Min).x = 0.0;
                }
                pIVar15->NavMoveDir = 2;
                pIVar15->NavMoveRequestFlags = 0x50;
              }
              goto LAB_0013c9df;
            }
            fVar49 = -(pIVar27->Scroll).y;
            pIVar27->NavRectRel[IVar43].Max.y = fVar49;
            pIVar27->NavRectRel[IVar43].Min.y = fVar49;
            fVar49 = (pIVar32->Min).x;
            pIVar3 = &pIVar27->NavRectRel[IVar43].Max;
            if (pIVar3->x <= fVar49 && fVar49 != pIVar3->x) {
              pIVar27->NavRectRel[IVar43].Max.x = 0.0;
              (pIVar32->Min).x = 0.0;
            }
            pIVar15->NavMoveDir = 3;
            pIVar15->NavMoveRequestFlags = 0x50;
            goto LAB_0013de8c;
          }
          pIVar15->NavMoveDir = 2;
          pIVar15->NavMoveClipDir = 3;
          pIVar15->NavMoveRequestFlags = 0x30;
        }
      }
    }
  }
LAB_0013c9df:
  if (pIVar38->NavMoveDir == -1) {
    if ((pIVar38->NavMoveRequest & 1U) != 0) goto LAB_0013ca1e;
  }
  else {
    pIVar38->NavMoveRequest = true;
    pIVar38->NavMoveRequestKeyMods = (pIVar38->IO).KeyMods;
    pIVar38->NavMoveDirLast = pIVar38->NavMoveDir;
LAB_0013ca1e:
    if (pIVar38->NavId == 0) {
      pIVar38->NavInitRequest = true;
      pIVar38->NavInitRequestFromMove = true;
      pIVar38->NavInitResultId = 0;
      pIVar38->NavDisableHighlight = false;
    }
  }
  NavUpdateAnyRequestFlag();
  pIVar27 = pIVar38->NavWindow;
  if (((pIVar27 != (ImGuiWindow *)0x0) && ((pIVar27->Flags & 0x40000) == 0)) &&
     (pIVar38->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar57 = ImGuiWindow::CalcFontSize(pIVar27);
    fVar57 = (float)(int)(fVar57 * 100.0 * (pIVar38->IO).DeltaTime + 0.5);
    if ((((pIVar27->DC).NavLayersActiveMask == 0) && ((pIVar27->DC).NavHasScroll == true)) &&
       (pIVar38->NavMoveRequest == true)) {
      uVar47 = pIVar38->NavMoveDir;
      if (uVar47 < 2) {
        lVar25 = 0x7c;
        lVar34 = 0x74;
        lVar42 = 0x6c;
        uVar48 = 0;
        lStack_80 = 0x5c;
      }
      else {
        if ((uVar47 & 0xfffffffe) != 2) goto LAB_0013cd89;
        uVar48 = 2;
        lVar25 = 0x80;
        lVar34 = 0x78;
        lVar42 = 0x70;
        lStack_80 = 0x60;
      }
      *(float *)((long)&pIVar27->Name + lVar42) =
           (float)(int)(*(float *)(&DAT_002a0834 + (ulong)(uVar47 == uVar48) * 4) * fVar57 +
                       *(float *)((long)&pIVar27->Name + lStack_80));
      *(undefined4 *)((long)&pIVar27->Name + lVar34) = 0;
      *(undefined4 *)((long)&pIVar27->Name + lVar25) = 0;
    }
LAB_0013cd89:
    IVar51 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar58 = IVar51.x;
    fVar50 = IVar51.y;
    if (((fVar58 != 0.0) || (NAN(fVar58))) && (pIVar27->ScrollbarX == true)) {
      (pIVar27->ScrollTarget).x = (float)(int)(fVar58 * fVar57 + (pIVar27->Scroll).x);
      (pIVar27->ScrollTargetCenterRatio).x = 0.0;
      (pIVar27->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    if ((fVar50 != 0.0) || (NAN(fVar50))) {
      (pIVar27->ScrollTarget).y = (float)(int)(fVar50 * fVar57 + (pIVar27->Scroll).y);
      (pIVar27->ScrollTargetCenterRatio).y = 0.0;
      (pIVar27->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  (pIVar38->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar38->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar38->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar38->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar38->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar38->NavMoveResultLocal).ID = 0;
  (pIVar38->NavMoveResultLocal).FocusScopeId = 0;
  (pIVar38->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar38->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar38->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar38->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar38->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar38->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (pIVar38->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar38->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar38->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar38->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar38->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar38->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar38->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar38->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar38->NavMoveResultOther).ID = 0;
  (pIVar38->NavMoveResultOther).FocusScopeId = 0;
  (pIVar38->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar38->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar38->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar38->NavMoveResultOther).RectRel.Max.y = 0.0;
  (pIVar38->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar38->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar38->NavMoveResultOther).DistCenter = 3.4028235e+38;
  if (((pIVar38->NavMoveRequest == true) && (pIVar38->NavInputSource == ImGuiInputSource_Gamepad))
     && (pIVar38->NavLayer == ImGuiNavLayer_Main)) {
    pIVar27 = pIVar38->NavWindow;
    IVar51 = (pIVar27->InnerRect).Min;
    fVar57 = (pIVar27->Pos).x;
    fVar58 = (pIVar27->Pos).y;
    IVar52 = (pIVar27->InnerRect).Max;
    local_58.Max.x = (IVar52.x - fVar57) + 1.0;
    local_58.Max.y = (IVar52.y - fVar58) + 1.0;
    local_58.Min.y = (IVar51.y - fVar58) + -1.0;
    local_58.Min.x = (IVar51.x - fVar57) + -1.0;
    bVar17 = ImRect::Contains(&local_58,pIVar27->NavRectRel);
    if (!bVar17) {
      fVar57 = ImGuiWindow::CalcFontSize(pIVar27);
      auVar61._0_4_ = fVar57 * 0.5;
      auVar60._0_4_ = local_58.Max.x - local_58.Min.x;
      auVar60._4_4_ = local_58.Max.y - local_58.Min.y;
      auVar60._8_4_ = local_58.Max.x - local_58.Max.x;
      auVar60._12_4_ = local_58.Max.y - local_58.Max.y;
      auVar61._4_4_ = auVar61._0_4_;
      auVar61._8_4_ = auVar61._0_4_;
      auVar61._12_4_ = auVar61._0_4_;
      auVar61 = minps(auVar60,auVar61);
      local_58.Max.x = local_58.Max.x - auVar61._0_4_;
      local_58.Max.y = local_58.Max.y - auVar61._4_4_;
      local_58.Min.y = auVar61._4_4_ + local_58.Min.y;
      local_58.Min.x = auVar61._0_4_ + local_58.Min.x;
      ImRect::ClipWithFull(pIVar27->NavRectRel + pIVar38->NavLayer,&local_58);
      pIVar38->NavId = 0;
      pIVar38->NavFocusScopeId = 0;
    }
  }
  pIVar27 = pIVar38->NavWindow;
  if (pIVar27 == (ImGuiWindow *)0x0) {
    fVar57 = 0.0;
    fVar50 = 0.0;
    fVar59 = 0.0;
    fVar58 = 1.0;
  }
  else {
    IVar43 = pIVar38->NavLayer;
    fVar58 = pIVar27->NavRectRel[IVar43].Min.x;
    fVar7 = pIVar27->NavRectRel[IVar43].Max.x;
    fVar50 = 0.0;
    if (fVar7 < fVar58) {
      fVar59 = 0.0;
      fVar65 = 0.0;
      fVar57 = 0.0;
    }
    else {
      fVar8 = pIVar27->NavRectRel[IVar43].Min.y;
      fVar9 = pIVar27->NavRectRel[IVar43].Max.y;
      fVar57 = 0.0;
      fVar65 = 0.0;
      fVar59 = 0.0;
      if (fVar8 <= fVar9) {
        fVar57 = fVar8;
        fVar65 = fVar58;
        fVar50 = fVar9;
        fVar59 = fVar7;
      }
    }
    fVar58 = (pIVar27->Pos).x;
    fVar7 = (pIVar27->Pos).y;
    fVar57 = fVar57 + fVar7;
    fVar59 = fVar59 + fVar58;
    fVar50 = fVar50 + fVar7;
    fVar58 = fVar65 + fVar58 + 1.0;
  }
  if (fVar59 <= fVar58) {
    fVar58 = fVar59;
  }
  (pIVar38->NavScoringRect).Min.y = fVar57 + fVar49;
  (pIVar38->NavScoringRect).Max.y = fVar50 + fVar49;
  (pIVar38->NavScoringRect).Min.x = fVar58;
  (pIVar38->NavScoringRect).Max.x = fVar58;
  if (fVar50 + fVar49 < fVar57 + fVar49) {
    __assert_fail("!g.NavScoringRect.IsInverted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x2450,"void ImGui::NavUpdate()");
  }
  pIVar38->NavScoringCount = 0;
  pIVar15 = GImGui;
  pIVar3 = &(GImGui->IO).MousePos;
  bVar17 = IsMousePosValid(pIVar3);
  if (bVar17) {
    IVar51 = (pIVar15->IO).MousePos;
    IVar52.x = (float)(int)IVar51.x;
    IVar52.y = (float)(int)IVar51.y;
    pIVar15->LastValidMousePos = IVar52;
    (pIVar15->IO).MousePos = IVar52;
  }
  bVar17 = IsMousePosValid(pIVar3);
  if ((bVar17) && (bVar17 = IsMousePosValid(&(pIVar15->IO).MousePosPrev), bVar17)) {
    IVar51 = (pIVar15->IO).MousePos;
    IVar52 = (pIVar15->IO).MousePosPrev;
    IVar53.x = IVar51.x - IVar52.x;
    IVar53.y = IVar51.y - IVar52.y;
    (pIVar15->IO).MouseDelta = IVar53;
    if (((IVar53.x != 0.0) || (NAN(IVar53.x))) || ((IVar53.y != 0.0 || (NAN(IVar53.y))))) {
      pIVar15->NavDisableMouseHover = false;
    }
  }
  else {
    (pIVar15->IO).MouseDelta.x = 0.0;
    (pIVar15->IO).MouseDelta.y = 0.0;
  }
  (pIVar15->IO).MousePosPrev = (pIVar15->IO).MousePos;
  for (lVar25 = 0; lVar25 != 5; lVar25 = lVar25 + 1) {
    if ((pIVar15->IO).MouseDown[lVar25] == true) {
      fVar49 = (pIVar15->IO).MouseDownDuration[lVar25];
      pbVar37 = (pIVar15->IO).MouseClicked + lVar25;
      *pbVar37 = fVar49 < 0.0;
      pbVar37[10] = false;
      (pIVar15->IO).MouseDownDurationPrev[lVar25] = fVar49;
      if (0.0 <= fVar49) {
        (pIVar15->IO).MouseDownDuration[lVar25] = fVar49 + (pIVar15->IO).DeltaTime;
        (pIVar15->IO).MouseDoubleClicked[lVar25] = false;
        bVar17 = IsMousePosValid(pIVar3);
        auVar56 = ZEXT816(0);
        if (bVar17) {
          IVar51 = (pIVar15->IO).MousePos;
          IVar52 = (pIVar15->IO).MouseClickedPos[lVar25];
          auVar56._0_4_ = IVar51.x - IVar52.x;
          auVar56._4_4_ = IVar51.y - IVar52.y;
          auVar56._8_8_ = 0;
        }
        fVar49 = (pIVar15->IO).MouseDragMaxDistanceSqr[lVar25];
        fVar57 = auVar56._0_4_ * auVar56._0_4_ + auVar56._4_4_ * auVar56._4_4_;
        uVar47 = -(uint)(fVar57 <= fVar49);
        (pIVar15->IO).MouseDragMaxDistanceSqr[lVar25] =
             (float)(~uVar47 & (uint)fVar57 | (uint)fVar49 & uVar47);
        IVar51 = (pIVar15->IO).MouseDragMaxDistanceAbs[lVar25];
        fVar49 = IVar51.x;
        fVar57 = IVar51.y;
        auVar62._0_8_ = auVar56._0_8_ ^ 0x8000000080000000;
        auVar62._8_4_ = auVar56._8_4_ ^ 0x80000000;
        auVar62._12_4_ = auVar56._12_4_ ^ 0x80000000;
        auVar61 = maxps(auVar62,auVar56);
        uVar47 = -(uint)(auVar61._0_4_ <= fVar49);
        uVar48 = -(uint)(auVar61._4_4_ <= fVar57);
        (pIVar15->IO).MouseDragMaxDistanceAbs[lVar25] =
             (ImVec2)(CONCAT44(~uVar48 & (uint)auVar61._4_4_,~uVar47 & (uint)auVar61._0_4_) |
                     CONCAT44((uint)fVar57 & uVar48,(uint)fVar49 & uVar47));
      }
      else {
        (pIVar15->IO).MouseDownDuration[lVar25] = 0.0;
        (pIVar15->IO).MouseDoubleClicked[lVar25] = false;
        dVar54 = pIVar15->Time;
        if ((float)(dVar54 - (pIVar15->IO).MouseClickedTime[lVar25]) <
            (pIVar15->IO).MouseDoubleClickTime) {
          bVar17 = IsMousePosValid(pIVar3);
          fVar49 = 0.0;
          fVar57 = 0.0;
          if (bVar17) {
            IVar51 = (pIVar15->IO).MousePos;
            IVar52 = (pIVar15->IO).MouseClickedPos[lVar25];
            fVar49 = IVar51.x - IVar52.x;
            fVar57 = IVar51.y - IVar52.y;
          }
          fVar58 = (pIVar15->IO).MouseDoubleClickMaxDist;
          if (fVar49 * fVar49 + fVar57 * fVar57 < fVar58 * fVar58) {
            (pIVar15->IO).MouseDoubleClicked[lVar25] = true;
          }
          dVar54 = (double)((pIVar15->IO).MouseDoubleClickTime * -2.0);
        }
        (pIVar15->IO).MouseClickedTime[lVar25] = dVar54;
        (pIVar15->IO).MouseClickedPos[lVar25] = (pIVar15->IO).MousePos;
        (pIVar15->IO).MouseDownWasDoubleClick[lVar25] = (pIVar15->IO).MouseDoubleClicked[lVar25];
        pIVar6 = (pIVar15->IO).MouseDragMaxDistanceAbs + lVar25;
        pIVar6->x = 0.0;
        pIVar6->y = 0.0;
        (pIVar15->IO).MouseDragMaxDistanceSqr[lVar25] = 0.0;
      }
    }
    else {
      (pIVar15->IO).MouseClicked[lVar25] = false;
      fVar49 = (pIVar15->IO).MouseDownDuration[lVar25];
      (pIVar15->IO).MouseReleased[lVar25] = 0.0 <= fVar49;
      pbVar37 = (pIVar15->IO).MouseClicked + lVar25;
      (pIVar15->IO).MouseDownDurationPrev[lVar25] = fVar49;
      (pIVar15->IO).MouseDownDuration[lVar25] = -1.0;
      (pIVar15->IO).MouseDoubleClicked[lVar25] = false;
    }
    if (((pIVar15->IO).MouseDown[lVar25] == false) && ((pIVar15->IO).MouseReleased[lVar25] == false)
       ) {
      (pIVar15->IO).MouseDownWasDoubleClick[lVar25] = false;
    }
    if (*pbVar37 == true) {
      pIVar15->NavDisableMouseHover = false;
    }
  }
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar27 = GetTopMostPopupModal();
  pIVar15 = local_38;
  if ((pIVar27 != (ImGuiWindow *)0x0) ||
     ((local_38->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < local_38->NavWindowingHighlightAlpha)))) {
    fVar49 = (local_38->IO).DeltaTime * 6.0 + local_38->DimBgRatio;
    if (1.0 <= fVar49) {
      fVar49 = 1.0;
    }
    local_38->DimBgRatio = fVar49;
  }
  else {
    fVar49 = (local_38->IO).DeltaTime * -10.0 + local_38->DimBgRatio;
    local_38->DimBgRatio = (float)(-(uint)(0.0 <= fVar49) & (uint)fVar49);
  }
  local_38->MouseCursor = 0;
  local_38->WantTextInputNextFrame = -1;
  local_38->WantCaptureMouseNextFrame = -1;
  local_38->WantCaptureKeyboardNextFrame = -1;
  (local_38->PlatformImePos).x = 1.0;
  pIVar38 = GImGui;
  (local_38->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar17 = IsMousePosValid((ImVec2 *)0x0);
    if (((bVar17) &&
        (fVar49 = (pIVar38->IO).MouseDragThreshold,
        fVar57 = (pIVar38->IO).MousePos.x - (pIVar38->WheelingWindowRefMousePos).x,
        fVar58 = (pIVar38->IO).MousePos.y - (pIVar38->WheelingWindowRefMousePos).y,
        fVar49 * fVar49 < fVar57 * fVar57 + fVar58 * fVar58)) ||
       (pIVar38->WheelingWindowTimer <= 0.0)) {
      pIVar38->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar38->WheelingWindowTimer = 0.0;
    }
  }
  fVar49 = (pIVar38->IO).MouseWheel;
  if (((((fVar49 != 0.0) || (fVar57 = (pIVar38->IO).MouseWheelH, fVar57 != 0.0)) || (NAN(fVar57)))
      && ((pIVar38->ActiveId == 0 || (pIVar38->ActiveIdUsingMouseWheel == false)))) &&
     (((pIVar38->HoveredIdPreviousFrame == 0 ||
       (pIVar38->HoveredIdPreviousFrameUsingMouseWheel == false)) &&
      (((pIVar27 = pIVar38->WheelingWindow, pIVar27 != (ImGuiWindow *)0x0 ||
        (pIVar27 = pIVar38->HoveredWindow, pIVar27 != (ImGuiWindow *)0x0)) &&
       (pIVar27->Collapsed == false)))))) {
    bVar17 = (pIVar38->IO).KeyCtrl;
    if ((fVar49 != 0.0) || (NAN(fVar49))) {
      if ((bVar17 & 1U) != 0) {
        if ((pIVar38->IO).FontAllowUserScaling == true) {
          StartLockWheelingWindow(pIVar27);
          fVar49 = pIVar27->FontWindowScale;
          fVar58 = (pIVar38->IO).MouseWheel * 0.1 + fVar49;
          fVar57 = 2.5;
          if (fVar58 <= 2.5) {
            fVar57 = fVar58;
          }
          fVar57 = (float)(-(uint)(fVar58 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar58 < 0.5) & (uint)fVar57);
          pIVar27->FontWindowScale = fVar57;
          if (pIVar27 == pIVar27->RootWindow) {
            fVar57 = fVar57 / fVar49;
            fVar49 = (pIVar27->Pos).x;
            fVar58 = (pIVar27->Pos).y;
            IVar51 = pIVar27->Size;
            auVar63._8_8_ = 0;
            auVar63._0_4_ = IVar51.x;
            auVar63._4_4_ = IVar51.y;
            IVar52 = (pIVar38->IO).MousePos;
            auVar64._0_4_ = (IVar52.x - fVar49) * (1.0 - fVar57) * IVar51.x;
            auVar64._4_4_ = (IVar52.y - fVar58) * (1.0 - fVar57) * IVar51.y;
            auVar64._8_8_ = 0;
            auVar61 = divps(auVar64,auVar63);
            local_58.Min.x = auVar61._0_4_ + fVar49;
            local_58.Min.y = auVar61._4_4_ + fVar58;
            SetWindowPos(pIVar27,&local_58.Min,0);
            IVar55.x = (float)(int)((pIVar27->Size).x * fVar57);
            IVar55.y = (float)(int)((pIVar27->Size).y * fVar57);
            IVar13.y = (float)(int)((pIVar27->SizeFull).y * fVar57);
            IVar13.x = (float)(int)((pIVar27->SizeFull).x * fVar57);
            pIVar27->Size = IVar55;
            pIVar27->SizeFull = IVar13;
          }
        }
        goto LAB_0013d50b;
      }
    }
    else if ((bVar17 & 1U) != 0) goto LAB_0013d50b;
    if (((pIVar38->IO).KeyShift != true) ||
       (local_78 = fVar49, (pIVar38->IO).ConfigMacOSXBehaviors == true)) {
      local_78 = (pIVar38->IO).MouseWheelH;
      if ((fVar49 != 0.0) || (NAN(fVar49))) {
        StartLockWheelingWindow(pIVar27);
        while ((uVar47 = pIVar27->Flags, (uVar47 >> 0x18 & 1) != 0 &&
               (((uVar47 & 0x210) == 0x10 ||
                ((fVar57 = (pIVar27->ScrollMax).y, fVar57 == 0.0 && (!NAN(fVar57)))))))) {
          pIVar27 = pIVar27->ParentWindow;
        }
        if ((uVar47 & 0x210) == 0) {
          local_48.x = ((pIVar27->InnerRect).Max.y - (pIVar27->InnerRect).Min.y) * 0.67;
          fVar58 = ImGuiWindow::CalcFontSize(pIVar27);
          fVar57 = fVar58 * 5.0;
          if (local_48.x <= fVar58 * 5.0) {
            fVar57 = local_48.x;
          }
          (pIVar27->ScrollTarget).y = (pIVar27->Scroll).y - fVar49 * (float)(int)fVar57;
          (pIVar27->ScrollTargetCenterRatio).y = 0.0;
          (pIVar27->ScrollTargetEdgeSnapDist).y = 0.0;
        }
      }
    }
    if ((local_78 != 0.0) || (NAN(local_78))) {
      StartLockWheelingWindow(pIVar27);
      while ((uVar47 = pIVar27->Flags, (uVar47 >> 0x18 & 1) != 0 &&
             (((uVar47 & 0x210) == 0x10 ||
              ((fVar49 = (pIVar27->ScrollMax).x, fVar49 == 0.0 && (!NAN(fVar49)))))))) {
        pIVar27 = pIVar27->ParentWindow;
      }
      if ((uVar47 & 0x210) == 0) {
        fVar57 = ((pIVar27->InnerRect).Max.x - (pIVar27->InnerRect).Min.x) * 0.67;
        fVar58 = ImGuiWindow::CalcFontSize(pIVar27);
        fVar49 = fVar58 + fVar58;
        if (fVar57 <= fVar58 + fVar58) {
          fVar49 = fVar57;
        }
        (pIVar27->ScrollTarget).x = (pIVar27->Scroll).x - local_78 * (float)(int)fVar49;
        (pIVar27->ScrollTargetCenterRatio).x = 0.0;
        (pIVar27->ScrollTargetEdgeSnapDist).x = 0.0;
      }
    }
  }
LAB_0013d50b:
  pIVar38 = GImGui;
  pIVar27 = GImGui->NavWindow;
  if ((((pIVar27 == (ImGuiWindow *)0x0) || (pIVar27->Active != true)) ||
      ((pIVar27->Flags & 0x40000) != 0)) || ((GImGui->IO).KeyCtrl != false)) {
    bVar17 = false;
  }
  else {
    bVar17 = IsKeyPressedMap(0,true);
  }
  pIVar38->TabFocusPressed = bVar17;
  if ((bVar17 == false) || (pIVar38->ActiveId != 0)) {
    pIVar27 = pIVar38->TabFocusRequestNextWindow;
  }
  else {
    pIVar27 = pIVar38->NavWindow;
    pIVar38->TabFocusRequestNextWindow = pIVar27;
    pIVar38->TabFocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar38->NavId == 0) || (pIVar38->NavIdTabCounter == 0x7fffffff)) {
      iVar39 = -(uint)(pIVar38->IO).KeyShift;
    }
    else {
      iVar39 = pIVar38->NavIdTabCounter - (uint)(pIVar38->IO).KeyShift;
    }
    pIVar38->TabFocusRequestNextCounterTabStop = iVar39;
  }
  pIVar38->TabFocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar38->TabFocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar38->TabFocusRequestCurrCounterTabStop = 0x7fffffff;
  if (pIVar27 != (ImGuiWindow *)0x0) {
    pIVar38->TabFocusRequestCurrWindow = pIVar27;
    if ((pIVar38->TabFocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar39 = (pIVar27->DC).FocusCounterRegular, iVar39 != -1)) {
      pIVar38->TabFocusRequestCurrCounterRegular =
           (pIVar38->TabFocusRequestNextCounterRegular + iVar39 + 1) % (iVar39 + 1);
    }
    if ((pIVar38->TabFocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar39 = (pIVar27->DC).FocusCounterTabStop, iVar39 != -1)) {
      pIVar38->TabFocusRequestCurrCounterTabStop =
           (pIVar38->TabFocusRequestNextCounterTabStop + iVar39 + 1) % (iVar39 + 1);
    }
    pIVar38->TabFocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar38->TabFocusRequestNextCounterRegular = 0x7fffffff;
    pIVar38->TabFocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar38->NavIdTabCounter = 0x7fffffff;
  iVar39 = (pIVar15->Windows).Size;
  if (iVar39 < (pIVar15->WindowsFocusOrder).Size) {
    __assert_fail("g.WindowsFocusOrder.Size <= g.Windows.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0xfd7,"void ImGui::NewFrame()");
  }
  local_78 = 3.4028235e+38;
  if ((pIVar15->GcCompactAll == false) &&
     (fVar49 = (pIVar15->IO).ConfigMemoryCompactTimer, 0.0 <= fVar49)) {
    local_78 = (float)pIVar15->Time - fVar49;
  }
  for (iVar40 = 0; iVar40 != iVar39; iVar40 = iVar40 + 1) {
    ppIVar29 = ImVector<ImGuiWindow_*>::operator[](&pIVar15->Windows,iVar40);
    pIVar27 = *ppIVar29;
    bVar17 = pIVar27->Active;
    pIVar27->WasActive = bVar17;
    pIVar27->BeginCount = 0;
    pIVar27->Active = false;
    pIVar27->WriteAccessed = false;
    if (((bVar17 == false) && (pIVar27->MemoryCompacted == false)) &&
       (pIVar27->LastTimeActive <= local_78 && local_78 != pIVar27->LastTimeActive)) {
      GcCompactTransientWindowBuffers(pIVar27);
    }
    iVar39 = (pIVar15->Windows).Size;
  }
  this_00 = &pIVar15->TablesLastTimeActive;
  for (iVar39 = 0; iVar39 < this_00->Size; iVar39 = iVar39 + 1) {
    pfVar30 = ImVector<float>::operator[](this_00,iVar39);
    if ((0.0 <= *pfVar30) &&
       (pfVar30 = ImVector<float>::operator[](this_00,iVar39),
       *pfVar30 <= local_78 && local_78 != *pfVar30)) {
      table = ImVector<ImGuiTable>::operator[](&(pIVar15->Tables).Buf,iVar39);
      TableGcCompactTransientBuffers(table);
    }
  }
  this_01 = &pIVar15->TablesTempDataStack;
  for (iVar39 = 0; iVar39 < this_01->Size; iVar39 = iVar39 + 1) {
    pIVar31 = ImVector<ImGuiTableTempData>::operator[](this_01,iVar39);
    if ((0.0 <= pIVar31->LastTimeActive) &&
       (pIVar31 = ImVector<ImGuiTableTempData>::operator[](this_01,iVar39),
       pIVar31->LastTimeActive <= local_78 && local_78 != pIVar31->LastTimeActive)) {
      pIVar31 = ImVector<ImGuiTableTempData>::operator[](this_01,iVar39);
      TableGcCompactTransientBuffers(pIVar31);
    }
  }
  if (pIVar15->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  pIVar15->GcCompactAll = false;
  if ((pIVar15->NavWindow != (ImGuiWindow *)0x0) && (pIVar15->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  ImVector<ImGuiWindow_*>::resize(&pIVar15->CurrentWindowStack,0);
  ImVector<ImGuiPopupData>::resize(&pIVar15->BeginPopupStack,0);
  ImVector<int>::resize(&pIVar15->ItemFlagsStack,0);
  local_58.Min = (ImVec2)((ulong)local_58.Min & 0xffffffff00000000);
  ImVector<int>::push_back(&pIVar15->ItemFlagsStack,(int *)&local_58);
  ImVector<ImGuiGroupData>::resize(&pIVar15->GroupStack,0);
  ClosePopupsOverWindow(pIVar15->NavWindow,false);
  pIVar38 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar38->DebugItemPickerActive == true) {
    uVar47 = pIVar38->HoveredIdPreviousFrame;
    pIVar38->MouseCursor = 7;
    bVar17 = IsKeyPressedMap(0xe,true);
    if (bVar17) {
      pIVar38->DebugItemPickerActive = false;
    }
    pIVar16 = GImGui;
    fVar49 = (GImGui->IO).MouseDownDuration[0];
    if ((fVar49 != 0.0) || (NAN(fVar49))) {
      uVar48 = (uint)(uVar47 == 0);
    }
    else if (uVar47 == 0) {
      uVar48 = 1;
    }
    else {
      pIVar38->DebugItemPickerBreakId = uVar47;
      pIVar38->DebugItemPickerActive = false;
      uVar48 = 0;
    }
    pIVar4 = &pIVar16->NextWindowData;
    *(byte *)&pIVar4->Flags = (byte)pIVar4->Flags | 0x40;
    (pIVar16->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltip();
    Text("HoveredId: 0x%08X",(ulong)uVar47);
    Text("Press ESC to abort picking.");
    TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar48 << 4)),
                "Click to break in debugger!");
    EndTooltip();
    pIVar38 = GImGui;
  }
  pIVar15->WithinFrameScopeWithImplicitWindow = true;
  *(byte *)&(pIVar38->NextWindowData).Flags = (byte)(pIVar38->NextWindowData).Flags | 2;
  (pIVar38->NextWindowData).SizeVal.x = 400.0;
  (pIVar38->NextWindowData).SizeVal.y = 400.0;
  (pIVar38->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (pIVar15->CurrentWindow->IsFallbackWindow != false) {
    CallContextHooks(pIVar15,ImGuiContextHookType_NewFramePost);
    return;
  }
  __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                ,0x1007,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempDataStack.Size; i++)
        if (g.TablesTempDataStack[i].LastTimeActive >= 0.0f && g.TablesTempDataStack[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempDataStack[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}